

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

void a__GLTexureUpload2D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  iVar1 = data->x;
  iVar2 = data->y;
  iVar5 = data->width + iVar1;
  iVar6 = data->height + iVar2;
  bVar7 = true;
  if (iVar5 <= tex->width) {
    bVar7 = tex->height < iVar6;
  }
  if (iVar2 < 1 && iVar1 < 1) {
    pvVar4 = data->pixels;
  }
  else {
    pvVar4 = (void *)0x0;
  }
  uVar3 = tf._0_8_ >> 0x20;
  if (binding != 0xde1) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3fc,"binding == GL_TEXTURE_2D");
    aAppTerminate(-1);
  }
  if (!(bool)(~bVar7 & pvVar4 == (void *)0x0)) {
    glTexImage2D(binding,0,tf._0_8_ & 0xffffffff,iVar5,iVar6,0,uVar3,tf.type,pvVar4);
    tex->width = iVar5;
    tex->height = iVar6;
  }
  if (iVar2 >= 1 || iVar1 >= 1) {
    if (data->pixels == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x406,"data->pixels");
      aAppTerminate(-1);
    }
    glTexSubImage2D(binding,0,data->x,data->y,data->width,data->height,uVar3,tf.type,data->pixels);
  }
  return;
}

Assistant:

static void a__GLTexureUpload2D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;
	const int maxheight = data->y + data->height;

	const int expand = (maxwidth > tex->width) || (maxheight > tex->height);
	const int is_subimage = (data->x > 0 || data->y > 0);
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_2D);

	if (expand || to_upload) {
		AGL__CALL(glTexImage2D(binding, 0, tf.internal, maxwidth, maxheight, 0,
			tf.format, tf.type, to_upload));
		tex->width = maxwidth;
		tex->height = maxheight;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage2D(binding, 0,
			data->x, data->y, data->width, data->height,
			tf.format, tf.type, data->pixels));
	}
}